

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::StopThreads(CConnman *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->threadI2PAcceptIncoming)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->threadMessageHandler)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->threadOpenConnections)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->threadOpenAddedConnections)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->threadDNSAddressSeed)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->threadSocketHandler)._M_id._M_thread == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::thread::join();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::StopThreads()
{
    if (threadI2PAcceptIncoming.joinable()) {
        threadI2PAcceptIncoming.join();
    }
    if (threadMessageHandler.joinable())
        threadMessageHandler.join();
    if (threadOpenConnections.joinable())
        threadOpenConnections.join();
    if (threadOpenAddedConnections.joinable())
        threadOpenAddedConnections.join();
    if (threadDNSAddressSeed.joinable())
        threadDNSAddressSeed.join();
    if (threadSocketHandler.joinable())
        threadSocketHandler.join();
}